

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpSendActionExAsync
              (UpnpClient_Handle Hnd,char *ActionURL_const,char *ServiceType_const,
              char *DevUDN_const,IXML_Document *Header,IXML_Document *Act,Upnp_FunPtr Fun,
              void *Cookie_const)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  job_arg *arg;
  undefined1 local_98 [4];
  int retVal;
  ThreadPoolJob job;
  char *ServiceType;
  char *ActionURL;
  char *headerStr;
  char *tmpStr;
  UpnpNonblockParam *Param;
  Handle_Info *SInfo;
  IXML_Document *Act_local;
  IXML_Document *Header_local;
  char *DevUDN_const_local;
  char *ServiceType_const_local;
  char *ActionURL_const_local;
  UpnpClient_Handle Hnd_local;
  
  Param = (UpnpNonblockParam *)0x0;
  job._40_8_ = ServiceType_const;
  SInfo = (Handle_Info *)Act;
  Act_local = Header;
  Header_local = (IXML_Document *)DevUDN_const;
  DevUDN_const_local = ServiceType_const;
  ServiceType_const_local = ActionURL_const;
  ActionURL_const_local._0_4_ = Hnd;
  memset(local_98,0,0x30);
  if (UpnpSdkInit == 1) {
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xc28,"Inside UpnpSendActionExAsync\n");
    if (Act_local == (IXML_Document *)0x0) {
      ActionURL_const_local._4_4_ =
           UpnpSendActionAsync((UpnpClient_Handle)ActionURL_const_local,ServiceType_const_local,
                               DevUDN_const_local,(char *)Header_local,(IXML_Document *)SInfo,Fun,
                               Cookie_const);
    }
    else {
      HandleReadLock(".upnp/src/api/upnpapi.c",0xc36);
      UVar1 = GetHandleInfo((UpnpClient_Handle)ActionURL_const_local,(Handle_Info **)&Param);
      if (UVar1 == HND_CLIENT) {
        HandleUnlock(".upnp/src/api/upnpapi.c",0xc3e);
        if (ActionURL_const == (char *)0x0) {
          ActionURL_const_local._4_4_ = -0x65;
        }
        else if (((job._40_8_ == 0) || (SInfo == (Handle_Info *)0x0)) || (Fun == (Upnp_FunPtr)0x0))
        {
          ActionURL_const_local._4_4_ = -0x65;
        }
        else {
          uVar3 = ixmlPrintNode(Act_local);
          lVar4 = ixmlPrintNode(SInfo);
          if (lVar4 == 0) {
            ixmlFreeDOMString(uVar3);
            ActionURL_const_local._4_4_ = -0x73;
          }
          else {
            arg = (job_arg *)malloc(0x760);
            if (arg == (job_arg *)0x0) {
              ixmlFreeDOMString(lVar4);
              ixmlFreeDOMString(uVar3);
              ActionURL_const_local._4_4_ = -0x68;
            }
            else {
              memset(arg,0,0x760);
              (arg->advertise).handle = 4;
              (arg->advertise).eventId = (UpnpClient_Handle)ActionURL_const_local;
              strncpy((arg->action).Url,ActionURL_const,0xff);
              strncpy((arg->action).ServiceType,(char *)job._40_8_,0xff);
              iVar2 = ixmlParseBufferEx(uVar3,&(arg->action).Header);
              if (iVar2 == 0) {
                iVar2 = ixmlParseBufferEx(lVar4,&(arg->action).Act);
                if (iVar2 == 0) {
                  ixmlFreeDOMString(lVar4);
                  ixmlFreeDOMString(uVar3);
                  (arg->action).Cookie = (char *)Cookie_const;
                  (arg->action).Fun = Fun;
                  TPJobInit((ThreadPoolJob *)local_98,UpnpThreadDistribution,arg);
                  TPJobSetFreeFunction((ThreadPoolJob *)local_98,free_action_arg);
                  TPJobSetPriority((ThreadPoolJob *)local_98,MED_PRIORITY);
                  iVar2 = ThreadPoolAdd(&gSendThreadPool,(ThreadPoolJob *)local_98,(int *)0x0);
                  if (iVar2 != 0) {
                    free_action_arg(arg);
                  }
                  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xc88,
                             "Exiting UpnpSendActionAsync\n");
                  ActionURL_const_local._4_4_ = 0;
                }
                else {
                  ixmlDocument_free((arg->action).Header);
                  free(arg);
                  ixmlFreeDOMString(lVar4);
                  ixmlFreeDOMString(uVar3);
                  if (iVar2 == 0x66) {
                    ActionURL_const_local._4_4_ = -0x68;
                  }
                  else {
                    ActionURL_const_local._4_4_ = -0x73;
                  }
                }
              }
              else {
                free(arg);
                ixmlFreeDOMString(lVar4);
                ixmlFreeDOMString(uVar3);
                if (iVar2 == 0x66) {
                  ActionURL_const_local._4_4_ = -0x68;
                }
                else {
                  ActionURL_const_local._4_4_ = -0x73;
                }
              }
            }
          }
        }
      }
      else {
        HandleUnlock(".upnp/src/api/upnpapi.c",0xc3b);
        ActionURL_const_local._4_4_ = -100;
      }
    }
  }
  else {
    ActionURL_const_local._4_4_ = -0x74;
  }
  return ActionURL_const_local._4_4_;
}

Assistant:

int UpnpSendActionExAsync(UpnpClient_Handle Hnd,
	const char *ActionURL_const,
	const char *ServiceType_const,
	const char *DevUDN_const,
	IXML_Document *Header,
	IXML_Document *Act,
	Upnp_FunPtr Fun,
	const void *Cookie_const)
{
	struct Handle_Info *SInfo = NULL;
	struct UpnpNonblockParam *Param;
	DOMString tmpStr;
	DOMString headerStr = NULL;
	char *ActionURL = (char *)ActionURL_const;
	char *ServiceType = (char *)ServiceType_const;
	ThreadPoolJob job;
	int retVal = 0;

	memset(&job, 0, sizeof(job));

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpSendActionExAsync\n");

	if (Header == NULL) {
		retVal = UpnpSendActionAsync(Hnd,
			ActionURL_const,
			ServiceType_const,
			DevUDN_const,
			Act,
			Fun,
			Cookie_const);
		return retVal;
	}

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	HandleUnlock(__FILE__, __LINE__);

	if (ActionURL == NULL) {
		return UPNP_E_INVALID_PARAM;
	}
	if (ServiceType == NULL || Act == NULL || Fun == NULL) {
		return UPNP_E_INVALID_PARAM;
	}

	headerStr = ixmlPrintNode((IXML_Node *)Header);

	tmpStr = ixmlPrintNode((IXML_Node *)Act);
	if (tmpStr == NULL) {
		ixmlFreeDOMString(headerStr);
		return UPNP_E_INVALID_ACTION;
	}

	Param = (struct UpnpNonblockParam *)malloc(
		sizeof(struct UpnpNonblockParam));
	if (Param == NULL) {
		ixmlFreeDOMString(tmpStr);
		ixmlFreeDOMString(headerStr);
		return UPNP_E_OUTOF_MEMORY;
	}
	memset(Param, 0, sizeof(struct UpnpNonblockParam));

	Param->FunName = ACTION;
	Param->Handle = Hnd;
	strncpy(Param->Url, ActionURL, sizeof(Param->Url) - 1);
	strncpy(Param->ServiceType,
		ServiceType,
		sizeof(Param->ServiceType) - 1);
	retVal = ixmlParseBufferEx(headerStr, &(Param->Header));
	if (retVal != IXML_SUCCESS) {
		free(Param);
		ixmlFreeDOMString(tmpStr);
		ixmlFreeDOMString(headerStr);
		if (retVal == IXML_INSUFFICIENT_MEMORY) {
			return UPNP_E_OUTOF_MEMORY;
		} else {
			return UPNP_E_INVALID_ACTION;
		}
	}

	retVal = ixmlParseBufferEx(tmpStr, &(Param->Act));
	if (retVal != IXML_SUCCESS) {
		ixmlDocument_free(Param->Header);
		free(Param);
		ixmlFreeDOMString(tmpStr);
		ixmlFreeDOMString(headerStr);
		if (retVal == IXML_INSUFFICIENT_MEMORY) {
			return UPNP_E_OUTOF_MEMORY;
		} else {
			return UPNP_E_INVALID_ACTION;
		}
	}

	ixmlFreeDOMString(tmpStr);
	ixmlFreeDOMString(headerStr);

	Param->Cookie = (void *)Cookie_const;
	Param->Fun = Fun;

	TPJobInit(&job, (start_routine)UpnpThreadDistribution, Param);
	TPJobSetFreeFunction(&job, (free_routine)free_action_arg);

	TPJobSetPriority(&job, MED_PRIORITY);
	if (ThreadPoolAdd(&gSendThreadPool, &job, NULL) != 0) {
		free_action_arg((job_arg *)Param);
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpSendActionAsync\n");

	return UPNP_E_SUCCESS;
}